

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O2

CURLcode curl_easy_send(Curl_easy *data,void *buffer,size_t buflen,size_t *n)

{
  CURLcode CVar1;
  curl_socket_t sfd;
  connectdata *c;
  ssize_t n1;
  
  c = (connectdata *)0x0;
  CVar1 = easy_connection(data,&sfd,&c);
  if (CVar1 == CURLE_OK) {
    *n = 0;
    CVar1 = Curl_write(c,sfd,buffer,buflen,&n1);
    if (n1 == -1) {
      CVar1 = CURLE_SEND_ERROR;
    }
    else if (CVar1 == CURLE_OK && n1 == 0) {
      CVar1 = CURLE_AGAIN;
    }
    else {
      *n = n1;
    }
  }
  return CVar1;
}

Assistant:

CURLcode curl_easy_send(struct Curl_easy *data, const void *buffer,
                        size_t buflen, size_t *n)
{
  curl_socket_t sfd;
  CURLcode result;
  ssize_t n1;
  struct connectdata *c = NULL;

  result = easy_connection(data, &sfd, &c);
  if(result)
    return result;

  *n = 0;
  result = Curl_write(c, sfd, buffer, buflen, &n1);

  if(n1 == -1)
    return CURLE_SEND_ERROR;

  /* detect EAGAIN */
  if(!result && !n1)
    return CURLE_AGAIN;

  *n = (size_t)n1;

  return result;
}